

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::verifyEmptyImage
          (LayeredRenderCase *this,Surface *layer,bool logging)

{
  ostringstream *poVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  TestLog *this_00;
  size_t __n;
  undefined7 in_register_00000011;
  void *__buf;
  void *__buf_00;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  allocator<char> local_30c;
  allocator<char> local_30b;
  allocator<char> local_30a;
  allocator<char> local_309;
  LayeredRenderCase *local_308;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  LogImageSet local_280;
  LogImage local_240;
  MessageBuilder local_1b0;
  
  local_308 = this;
  if ((int)CONCAT71(in_register_00000011,logging) != 0) {
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Expecting empty image");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  uVar2 = layer->m_width;
  __n = (size_t)uVar2;
  iVar3 = layer->m_height;
  iVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  iVar8 = 0;
  if (0 < iVar3) {
    iVar8 = iVar3;
  }
  iVar11 = 0;
  do {
    if (iVar11 == iVar8) {
LAB_003f7a32:
      bVar12 = logging && iVar3 <= iVar11;
      if (bVar12) {
        local_1b0.m_log =
             ((local_308->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = &local_1b0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"Image is valid");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      return bVar12 || iVar3 <= iVar11;
    }
    iVar5 = 1;
    uVar10 = uVar7;
    iVar9 = iVar6;
    while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
      uVar4 = *(uint *)((long)(layer->m_pixels).m_ptr + (long)iVar9 * 4);
      iVar5 = iVar5 + -1;
      iVar9 = iVar9 + 1;
      if (((0x8ffff < (uVar4 & 0xff0000)) && (8 < (uVar4 & 0xff))) && (0x8ff < (uVar4 & 0xff00))) {
        if (!logging) {
          return iVar3 <= iVar11;
        }
        local_1b0.m_log =
             ((local_308->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = &local_1b0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"Found (at least) one bad pixel at ");
        std::ostream::operator<<(poVar1,-iVar5);
        std::operator<<((ostream *)poVar1,",");
        std::ostream::operator<<(poVar1,iVar11);
        std::operator<<((ostream *)poVar1,". Pixel color is not background color.");
        this_00 = tcu::MessageBuilder::operator<<
                            (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,"LayerContent",&local_309);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c0,"Layer content",&local_30a);
        tcu::LogImageSet::LogImageSet(&local_280,&local_2a0,&local_2c0);
        tcu::LogImageSet::write(&local_280,(int)this_00,__buf,__n);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"Layer",&local_30b);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"Layer",&local_30c);
        tcu::LogImage::LogImage
                  (&local_240,&local_2e0,&local_300,layer,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_240,(int)this_00,__buf_00,(size_t)layer);
        tcu::TestLog::endImageSet(this_00);
        tcu::LogImage::~LogImage(&local_240);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_2e0);
        tcu::LogImageSet::~LogImageSet(&local_280);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        goto LAB_003f7a32;
      }
    }
    iVar11 = iVar11 + 1;
    iVar6 = iVar6 + uVar2;
  } while( true );
}

Assistant:

bool LayeredRenderCase::verifyEmptyImage (const tcu::Surface& layer, bool logging)
{
	// Expect black
	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Message << "Expecting empty image" << tcu::TestLog::EndMessage;

	for (int y = 0; y < layer.getHeight(); ++y)
	for (int x = 0; x < layer.getWidth(); ++x)
	{
		const tcu::RGBA color		= layer.getPixel(x, y);
		const int		threshold	= 8;
		const bool		isBlack		= color.getRed() <= threshold || color.getGreen() <= threshold || color.getBlue() <= threshold;

		if (!isBlack)
		{
			if (logging)
				m_testCtx.getLog()	<< tcu::TestLog::Message
									<< "Found (at least) one bad pixel at " << x << "," << y << ". Pixel color is not background color."
									<< tcu::TestLog::EndMessage
									<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
									<< tcu::TestLog::Image("Layer", "Layer", layer)
									<< tcu::TestLog::EndImageSet;
			return false;
		}
	}

	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Message << "Image is valid" << tcu::TestLog::EndMessage;

	return true;
}